

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  Curl_share *pCVar3;
  curl_slist *pcVar4;
  curl_trc_feat *pcVar5;
  int iVar6;
  CURLcode CVar7;
  size_t sVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  char *pcVar11;
  Curl_addrinfo *pCVar12;
  uint uVar13;
  size_t in_R8;
  Curl_hash *h;
  Curl_addrinfo *pCVar14;
  bool bVar15;
  char *host;
  curl_off_t port;
  Curl_str source;
  curl_off_t num;
  char entry_id [262];
  char *local_1c0;
  Curl_addrinfo *local_1b8;
  size_t local_1b0;
  Curl_str local_1a8;
  CURLcode local_194;
  char *local_190;
  Curl_addrinfo *local_188;
  Curl_addrinfo *local_180;
  curl_off_t local_178 [8];
  Curl_str local_138 [16];
  
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 8) == 0)) {
    h = &(data->multi->dnscache).entries;
    if (data->multi == (Curl_multi *)0x0) {
      h = (Curl_hash *)0x0;
    }
  }
  else {
    h = &(pCVar3->dnscache).entries;
  }
  if (h == (Curl_hash *)0x0) {
    CVar7 = CURLE_FAILED_INIT;
  }
  else {
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 & 0xfb;
    for (pcVar4 = (data->state).resolve; pcVar4 != (curl_slist *)0x0; pcVar4 = pcVar4->next) {
      local_1c0 = pcVar4->data;
      if (local_1c0 == (char *)0x0) {
        uVar13 = 0;
      }
      else {
        if (*local_1c0 == '-') {
          local_178[0] = 0;
          local_1c0 = local_1c0 + 1;
          iVar6 = Curl_str_single(&local_1c0,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&local_1c0,&local_1a8,0x2e,']');
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_1c0,']');
              goto LAB_00133c42;
            }
LAB_00133da9:
            bVar15 = false;
          }
          else {
            iVar6 = Curl_str_until(&local_1c0,&local_1a8,0x1000,':');
LAB_00133c42:
            if ((iVar6 != 0) || (iVar6 = Curl_str_single(&local_1c0,':'), iVar6 != 0))
            goto LAB_00133da9;
            iVar6 = Curl_str_number(&local_1c0,local_178,0xffff);
            bVar15 = true;
            if (iVar6 == 0) {
              sVar8 = create_dnscache_id(local_1a8.str,
                                         CONCAT44(local_1a8.len._4_4_,(uint)local_1a8.len),
                                         (int)local_178[0],(char *)local_138,in_R8);
              if ((data->share != (Curl_share *)0x0) && (&(data->share->dnscache).entries == h)) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              Curl_hash_delete(h,local_138,sVar8 + 1);
              if ((data->share != (Curl_share *)0x0) && (&(data->share->dnscache).entries == h)) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
            }
          }
          uVar13 = 0;
          if (!bVar15) goto LAB_00133db8;
        }
        else {
          local_1b0 = 0;
          cVar2 = *local_1c0;
          if (cVar2 == '+') {
            local_1c0 = local_1c0 + 1;
          }
          iVar6 = Curl_str_single(&local_1c0,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&local_1c0,&local_1a8,0x2e,']');
            uVar13 = 4;
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_1c0,']');
              goto LAB_00133d61;
            }
          }
          else {
            iVar6 = Curl_str_until(&local_1c0,&local_1a8,0x1000,':');
LAB_00133d61:
            uVar13 = 4;
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_1c0,':');
              bVar15 = true;
              if (iVar6 == 0) {
                iVar6 = Curl_str_number(&local_1c0,(curl_off_t *)&local_1b0,0xffff);
                if ((iVar6 == 0) && (iVar6 = Curl_str_single(&local_1c0,':'), iVar6 == 0)) {
                  local_190 = local_1c0;
                  if (*local_1c0 != '\0') {
                    local_180 = (Curl_addrinfo *)0x0;
                    local_1b8 = (Curl_addrinfo *)0x0;
LAB_001340b4:
                    iVar6 = Curl_str_single(&local_1c0,'[');
                    if (iVar6 == 0) {
                      iVar6 = Curl_str_until(&local_1c0,local_138,0x2e,']');
                      uVar13 = 5;
                      if ((iVar6 == 0) && (iVar6 = Curl_str_single(&local_1c0,']'), iVar6 == 0))
                      goto LAB_0013413c;
                    }
                    else {
                      iVar6 = Curl_str_until(&local_1c0,local_138,0x1000,',');
                      if (iVar6 == 0) {
LAB_0013413c:
                        uVar13 = 5;
                        if (local_138[0].len < (Curl_addrinfo *)0x40) {
                          local_188 = (Curl_addrinfo *)local_138[0].len;
                          memcpy(local_178,local_138[0].str,local_138[0].len);
                          *(undefined1 *)((long)local_178 + (long)local_188) = 0;
                          pCVar12 = Curl_str2addr((char *)local_178,(int)local_1b0);
                          if (pCVar12 == (Curl_addrinfo *)0x0) {
                            if (((data != (Curl_easy *)0x0) &&
                                (((data->set).field_0x897 & 0x40) != 0)) &&
                               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                                (0 < pcVar5->log_level)))) {
                              Curl_infof(data,"Resolve address \'%s\' found illegal",local_178);
                            }
                          }
                          else {
                            pCVar14 = pCVar12;
                            if (local_180 != (Curl_addrinfo *)0x0) {
                              local_180->ai_next = pCVar12;
                              pCVar14 = local_1b8;
                            }
                            local_188 = pCVar12;
                            uVar13 = Curl_str_single(&local_1c0,',');
                            if (uVar13 != 0) {
                              uVar13 = 7;
                            }
                            local_180 = local_188;
                            local_1b8 = pCVar14;
                          }
                        }
                      }
                      else {
                        iVar6 = Curl_str_single(&local_1c0,',');
                        uVar13 = (iVar6 == 0) + 5;
                      }
                    }
                    switch(uVar13) {
                    case 0:
                    case 6:
                      goto switchD_001341f0_caseD_0;
                    default:
                      goto switchD_001341f0_caseD_1;
                    case 5:
                      pcVar11 = local_190;
                      pCVar12 = local_1b8;
                      goto LAB_00133e4e;
                    case 7:
                      goto switchD_001341f0_caseD_7;
                    }
                  }
                  local_1b8 = (Curl_addrinfo *)0x0;
switchD_001341f0_caseD_7:
                  bVar15 = local_1b8 == (Curl_addrinfo *)0x0;
                  pcVar11 = local_190;
                  pCVar12 = local_1b8;
                }
                else {
                  pcVar11 = (char *)0x0;
                  pCVar12 = (Curl_addrinfo *)0x0;
LAB_00133e4e:
                  bVar15 = true;
                }
              }
              else {
                pcVar11 = (char *)0x0;
                pCVar12 = (Curl_addrinfo *)0x0;
              }
              if (bVar15) {
                Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar4->data);
                Curl_freeaddrinfo(pCVar12);
                local_194 = CURLE_SETOPT_OPTION_SYNTAX;
                uVar13 = 1;
              }
              else {
                local_1b8 = pCVar12;
                local_190 = pcVar11;
                sVar8 = create_dnscache_id(local_1a8.str,
                                           CONCAT44(local_1a8.len._4_4_,(uint)local_1a8.len),
                                           (int)local_1b0,(char *)local_138,in_R8);
                if ((data->share != (Curl_share *)0x0) && (&(data->share->dnscache).entries == h)) {
                  Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
                }
                pvVar9 = Curl_hash_pick(h,local_138,sVar8 + 1);
                if (pvVar9 != (void *)0x0) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar5->log_level)))) {
                    Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",
                               (ulong)(uint)local_1a8.len,local_1a8.str,local_1b0);
                  }
                  Curl_hash_delete(h,local_138,sVar8 + 1);
                }
                in_R8 = CONCAT44(local_1a8.len._4_4_,(uint)local_1a8.len);
                pCVar10 = dnscache_add_addr(data,(Curl_dnscache *)h,local_1b8,local_1a8.str,in_R8,
                                            (int)local_1b0,cVar2 != '+');
                if (pCVar10 == (Curl_dns_entry *)0x0) {
                  local_194 = CURLE_OUT_OF_MEMORY;
                  uVar13 = 1;
                  if ((data->share != (Curl_share *)0x0) && (&(data->share->dnscache).entries == h))
                  {
                    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
                  }
                }
                else {
                  pCVar10->refcount = pCVar10->refcount - 1;
                  if ((data->share != (Curl_share *)0x0) && (&(data->share->dnscache).entries == h))
                  {
                    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
                  }
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar5->log_level)))) {
                    pcVar11 = " (non-permanent)";
                    if (cVar2 != '+') {
                      pcVar11 = "";
                    }
                    in_R8 = local_1b0;
                    Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)local_1a8.len,
                               local_1a8.str,local_1b0,local_190,pcVar11);
                  }
                  iVar6 = Curl_str_casecompare(&local_1a8,"*");
                  uVar13 = 0;
                  if (iVar6 != 0) {
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar5->log_level)))) {
                      Curl_infof(data,"RESOLVE *:%ld using wildcard",local_1b0);
                    }
                    puVar1 = &(data->state).field_0x7c0;
                    *puVar1 = *puVar1 | 4;
                  }
                }
              }
            }
          }
switchD_001341f0_caseD_1:
          if (uVar13 != 0) goto LAB_00133db8;
        }
        uVar13 = 0;
      }
LAB_00133db8:
      if ((uVar13 & 0xfffffffb) != 0) {
        return local_194;
      }
    }
    (data->state).resolve = (curl_slist *)0x0;
    CVar7 = CURLE_OK;
  }
  return CVar7;
switchD_001341f0_caseD_0:
  if (*local_1c0 == '\0') goto switchD_001341f0_caseD_7;
  goto LAB_001340b4;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}